

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::adjugate(mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  mat4 *in_RDI;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  fVar1 = m->m[1].y;
  fVar2 = m->m[1].x;
  fVar3 = m->m[0].x;
  fVar4 = m->m[0].y;
  fVar17 = fVar3 * fVar1 - fVar4 * fVar2;
  fVar5 = m->m[1].z;
  fVar6 = m->m[0].z;
  fVar22 = fVar3 * fVar5 - fVar6 * fVar2;
  fVar7 = m->m[1].w;
  fVar8 = m->m[0].w;
  fVar20 = fVar3 * fVar7 - fVar8 * fVar2;
  fVar26 = fVar4 * fVar5 - fVar6 * fVar1;
  fVar21 = fVar4 * fVar7 - fVar8 * fVar1;
  fVar23 = fVar6 * fVar7 - fVar8 * fVar5;
  fVar9 = m->m[3].z;
  fVar10 = m->m[2].w;
  fVar11 = m->m[2].z;
  fVar12 = m->m[3].w;
  fVar18 = fVar11 * fVar12 - fVar10 * fVar9;
  fVar13 = m->m[3].y;
  fVar14 = m->m[2].y;
  fVar24 = fVar14 * fVar12 - fVar10 * fVar13;
  fVar25 = fVar14 * fVar9 - fVar11 * fVar13;
  fVar15 = m->m[3].x;
  fVar16 = m->m[2].x;
  fVar27 = fVar16 * fVar12 - fVar10 * fVar15;
  fVar28 = fVar16 * fVar9 - fVar11 * fVar15;
  fVar19 = fVar16 * fVar13 - fVar14 * fVar15;
  in_RDI->m[1].x = 0.0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  in_RDI->m[0].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[2].z = 0.0;
  in_RDI->m[2].w = 0.0;
  in_RDI->m[3].x = 0.0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[3].w = 0.0;
  in_RDI->m[0].y = 0.0;
  in_RDI->m[0].z = 0.0;
  *(undefined8 *)&in_RDI->m[0].w = 0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[1].w = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  *(undefined8 *)&in_RDI->m[2].w = 0;
  in_RDI->m[3].y = 0.0;
  in_RDI->m[3].z = 0.0;
  in_RDI->m[0].x = fVar7 * fVar25 + (fVar1 * fVar18 - fVar24 * fVar5);
  in_RDI->m[0].y = (fVar6 * fVar24 - fVar4 * fVar18) - fVar8 * fVar25;
  in_RDI->m[0].z = fVar12 * fVar26 + (fVar13 * fVar23 - fVar21 * fVar9);
  in_RDI->m[0].w = (fVar11 * fVar21 - fVar14 * fVar23) - fVar10 * fVar26;
  in_RDI->m[1].x = (fVar5 * fVar27 - fVar2 * fVar18) - fVar7 * fVar28;
  in_RDI->m[1].y = fVar8 * fVar28 + (fVar18 * fVar3 - fVar27 * fVar6);
  in_RDI->m[1].z = (fVar20 * fVar9 - fVar15 * fVar23) - fVar12 * fVar22;
  in_RDI->m[1].w = fVar10 * fVar22 + (fVar23 * fVar16 - fVar20 * fVar11);
  in_RDI->m[2].x = fVar7 * fVar19 + (fVar2 * fVar24 - fVar27 * fVar1);
  in_RDI->m[2].y = (fVar4 * fVar27 - fVar24 * fVar3) - fVar8 * fVar19;
  in_RDI->m[2].z = fVar12 * fVar17 + (fVar15 * fVar21 - fVar20 * fVar13);
  in_RDI->m[2].w = (fVar20 * fVar14 - fVar21 * fVar16) - fVar10 * fVar17;
  in_RDI->m[3].x = (fVar1 * fVar28 - fVar2 * fVar25) - fVar5 * fVar19;
  in_RDI->m[3].y = fVar19 * fVar6 + (fVar25 * fVar3 - fVar28 * fVar4);
  in_RDI->m[3].z = (fVar13 * fVar22 - fVar15 * fVar26) - fVar9 * fVar17;
  in_RDI->m[3].w = fVar17 * fVar11 + (fVar26 * fVar16 - fVar22 * fVar14);
  return in_RDI;
}

Assistant:

mat4 adjugate(const mat4& m)
{
    /* based on Laplace expansion theorem */
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    mat4 a;

    M00(a) = M11(m)*c5 - M12(m)*c4 + M13(m)*c3;
    M01(a) =-M01(m)*c5 + M02(m)*c4 - M03(m)*c3;
    M02(a) = M31(m)*s5 - M32(m)*s4 + M33(m)*s3;
    M03(a) =-M21(m)*s5 + M22(m)*s4 - M23(m)*s3;

    M10(a) =-M10(m)*c5 + M12(m)*c2 - M13(m)*c1;
    M11(a) = M00(m)*c5 - M02(m)*c2 + M03(m)*c1;
    M12(a) =-M30(m)*s5 + M32(m)*s2 - M33(m)*s1;
    M13(a) = M20(m)*s5 - M22(m)*s2 + M23(m)*s1;

    M20(a) = M10(m)*c4 - M11(m)*c2 + M13(m)*c0;
    M21(a) =-M00(m)*c4 + M01(m)*c2 - M03(m)*c0;
    M22(a) = M30(m)*s4 - M31(m)*s2 + M33(m)*s0;
    M23(a) =-M20(m)*s4 + M21(m)*s2 - M23(m)*s0;

    M30(a) =-M10(m)*c3 + M11(m)*c1 - M12(m)*c0;
    M31(a) = M00(m)*c3 - M01(m)*c1 + M02(m)*c0;
    M32(a) =-M30(m)*s3 + M31(m)*s1 - M32(m)*s0;
    M33(a) = M20(m)*s3 - M21(m)*s1 + M22(m)*s0;

    return a;
}